

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

void __thiscall QUrlQuery::removeAllQueryItems(QUrlQuery *this,QString *key)

{
  long lVar1;
  QUrlQueryPrivate *pQVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QUrlQueryPrivate *p;
  anon_class_8_1_8024282f_for__M_pred firstEqualsEncodedKey;
  QString encodedKey;
  QList<std::pair<QString,_QString>_> *in_stack_ffffffffffffff80;
  anon_class_8_1_8024282f_for__M_pred pred;
  QUrlQueryPrivate *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QSharedDataPointer<QUrlQueryPrivate>::constData
                     ((QSharedDataPointer<QUrlQueryPrivate> *)0x3153c5);
  if (pQVar2 != (QUrlQueryPrivate *)0x0) {
    QSharedDataPointer<QUrlQueryPrivate>::data
              ((QSharedDataPointer<QUrlQueryPrivate> *)in_stack_ffffffffffffff80);
    pred.encodedKey = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QUrlQueryPrivate::recodeFromUser(in_stack_ffffffffffffffc8,in_RDI);
    QList<std::pair<QString,QString>>::removeIf<QUrlQuery::removeAllQueryItems(QString_const&)::__0>
              (in_stack_ffffffffffffff80,pred);
    QString::~QString((QString *)0x315454);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlQuery::removeAllQueryItems(const QString &key)
{
    if (d.constData()) {
        auto *p = d.data();
        const QString encodedKey = p->recodeFromUser(key);
        auto firstEqualsEncodedKey = [&encodedKey](const std::pair<QString, QString> &item) {
            return item.first == encodedKey;
        };
        p->itemList.removeIf(firstEqualsEncodedKey);
    }
}